

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

int __thiscall pfederc::Lexer::nextChar(Lexer *this)

{
  int iVar1;
  int_type iVar2;
  Lexer *this_local;
  
  iVar1 = std::istream::get();
  this->currentChar = iVar1;
  iVar1 = this->currentChar;
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 == iVar2) {
    std::__cxx11::string::operator+=((string *)&this->fileContent,' ');
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->fileContent,(char)this->currentChar);
  }
  this->currentEndIndex = this->currentEndIndex + 1;
  return this->currentChar;
}

Assistant:

int Lexer::nextChar() noexcept {
  currentChar = input.get();
  if (currentChar != std::char_traits<char>::eof()) {
    fileContent += static_cast<char>(currentChar);
  } else
    fileContent += ' ';
  ++currentEndIndex;
  return currentChar;
}